

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

int __thiscall
asmjit::BaseAssembler::bind(BaseAssembler *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  CodeHolder *this_00;
  Error EVar1;
  undefined4 in_register_00000034;
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar1 = 5;
  }
  else {
    EVar1 = CodeHolder::bindLabel
                      (this_00,(Label *)CONCAT44(in_register_00000034,__fd),this->_section->_id,
                       (long)this->_bufferPtr - (long)this->_bufferData);
    if ((this->super_BaseEmitter)._logger != (Logger *)0x0) {
      EmitterUtils::logLabelBound(this,(Label *)CONCAT44(in_register_00000034,__fd));
    }
    (this->super_BaseEmitter)._inlineComment = (char *)0x0;
    if (EVar1 == 0) {
      return 0;
    }
  }
  EVar1 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar1,(char *)0x0);
  return EVar1;
}

Assistant:

Error BaseAssembler::bind(const Label& label) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  Error err = _code->bindLabel(label, _section->id(), offset());

#ifndef ASMJIT_NO_LOGGING
  if (_logger)
    EmitterUtils::logLabelBound(this, label);
#endif

  resetInlineComment();
  if (err)
    return reportError(err);

  return kErrorOk;
}